

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O3

int Abc_TtReadHex(word *pTruth,char *pString)

{
  byte bVar1;
  uint uVar2;
  word wVar3;
  byte bVar4;
  size_t __n;
  byte *pbVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  
  bVar4 = *pString;
  if (bVar4 == 0x30) {
    pString = pString + (ulong)(pString[1] == 'x') * 2;
    bVar4 = *pString;
  }
  if (((byte)(bVar4 - 0x3a) < 0xf6) && ((byte)((bVar4 & 0xdf) + 0xb9) < 0xfa)) {
    *pTruth = 0;
    uVar6 = 2;
    bVar11 = true;
    uVar7 = 0;
  }
  else {
    uVar10 = 0;
    do {
      do {
        uVar7 = uVar10;
        uVar10 = uVar7 + 1;
      } while (0xf5 < (byte)(((byte *)pString)[uVar7 + 1] - 0x3a));
    } while (0xf9 < (byte)((((byte *)pString)[uVar7 + 1] & 0xdf) + 0xb9));
    uVar9 = (uint)uVar10;
    if (uVar9 == 0) {
      __n = 8;
      bVar11 = true;
      uVar6 = 2;
LAB_004a5ebd:
      memset(pTruth,0,__n);
      if (uVar9 != 0) goto LAB_004a5ecc;
    }
    else {
      if (uVar9 != 1) {
        uVar2 = 0x1f;
        if ((uint)uVar7 != 0) {
          for (; (uint)uVar7 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        uVar6 = 0x22 - (uVar2 ^ 0x1f);
        uVar2 = 1 << (0x1cU - (char)(uVar2 ^ 0x1f) & 0x1f);
        if (uVar9 < 0x11) {
          uVar2 = 1;
        }
        bVar11 = uVar9 < 9;
        __n = (ulong)uVar2 << 3;
        goto LAB_004a5ebd;
      }
      if (bVar4 < 0x41) {
        if (bVar4 == 0x30) {
LAB_004a5fb3:
          wVar3 = -(ulong)(bVar4 != 0x30);
          uVar6 = 0;
          goto LAB_004a5f9b;
        }
        if (bVar4 != 0x35) goto LAB_004a5fe2;
LAB_004a5fc1:
        wVar3 = 0xaaaaaaaaaaaaaaaa;
        if (bVar4 == 0x35) {
          wVar3 = 0x5555555555555555;
        }
        uVar6 = 1;
        goto LAB_004a5f9b;
      }
      if (bVar4 == 0x41) goto LAB_004a5fc1;
      if (bVar4 == 0x46) goto LAB_004a5fb3;
LAB_004a5fe2:
      *pTruth = 0;
      uVar10 = 1;
      uVar6 = 3;
      bVar11 = true;
LAB_004a5ecc:
      pbVar5 = (byte *)pString + (int)uVar10;
      bVar4 = 0;
      uVar7 = 0;
      do {
        pbVar5 = pbVar5 + -1;
        bVar1 = *pbVar5;
        iVar8 = -0x30;
        if (((9 < (byte)(bVar1 - 0x30)) && (iVar8 = -0x37, 5 < (byte)(bVar1 + 0xbf))) &&
           (iVar8 = -0x57, 5 < (byte)(bVar1 + 0x9f))) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                        ,0x343,"int Abc_TtReadHexDigit(char)");
        }
        pTruth[uVar7 >> 4 & 0xfffffff] =
             pTruth[uVar7 >> 4 & 0xfffffff] | (ulong)(iVar8 + (uint)bVar1) << (bVar4 & 0x3c);
        uVar7 = uVar7 + 1;
        bVar4 = bVar4 + 4;
      } while ((uVar10 & 0xffffffff) != uVar7);
    }
    if (!bVar11) {
      return uVar6;
    }
    uVar10 = *pTruth;
    bVar4 = (byte)((int)uVar10 << 4) | (byte)uVar10 & 0xf;
    if (2 < uVar6) {
      bVar4 = (byte)uVar10;
    }
    uVar7 = (ulong)CONCAT11(bVar4,bVar4);
    uVar9 = 3;
    if (3 < uVar6) {
      uVar7 = uVar10;
      uVar9 = uVar6;
    }
    bVar11 = uVar9 - 3 < 2;
  }
  uVar10 = (ulong)((uint)uVar7 << 0x10 | (uint)uVar7 & 0xffff);
  if (!bVar11) {
    uVar10 = uVar7;
  }
  wVar3 = (uVar10 & 0xffffffff) * 0x100000001;
LAB_004a5f9b:
  *pTruth = wVar3;
  return uVar6;
}

Assistant:

static inline int Abc_TtReadHex( word * pTruth, char * pString )
{
    int k, nVars, Digit, nDigits;
    // skip the first 2 symbols if they are "0x"
    if ( pString[0] == '0' && pString[1] == 'x' )
        pString += 2;
    // count the number of hex digits
    nDigits = 0;
    for ( k = 0; Abc_TtIsHexDigit(pString[k]); k++ )
        nDigits++;
    if ( nDigits == 1 )
    {
        if ( pString[0] == '0' || pString[0] == 'F' )
        {
            pTruth[0] = (pString[0] == '0') ? 0 : ~(word)0;
            return 0;
        }
        if ( pString[0] == '5' || pString[0] == 'A' )
        {
            pTruth[0] = (pString[0] == '5') ? s_Truths6Neg[0] : s_Truths6[0];
            return 1;
        }
    }
    // determine the number of variables
    nVars = 2 + Abc_Base2Log( nDigits );
    // clean storage
    for ( k = Abc_TtWordNum(nVars) - 1; k >= 0; k-- )
        pTruth[k] = 0;
    // read hexadecimal digits in the reverse order
    // (the last symbol in the string is the least significant digit)
    for ( k = 0; k < nDigits; k++ )
    {
        Digit = Abc_TtReadHexDigit( pString[nDigits - 1 - k] );
        assert( Digit >= 0 && Digit < 16 );
        Abc_TtSetHex( pTruth, k, Digit );
    }
    if ( nVars < 6 )
        pTruth[0] = Abc_Tt6Stretch( pTruth[0], nVars );
    return nVars;
}